

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_query_result.cpp
# Opt level: O2

void __thiscall
duckdb::StreamQueryResult::CheckExecutableInternal(StreamQueryResult *this,ClientContextLock *lock)

{
  bool bVar1;
  InvalidInputException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50 [32];
  string error_str;
  
  bVar1 = IsOpenInternal(this,lock);
  if (bVar1) {
    return;
  }
  ::std::__cxx11::string::string
            ((string *)&error_str,
             "Attempting to execute an unsuccessful or closed pending query result",
             (allocator *)&local_90);
  if ((this->super_QueryResult).super_BaseQueryResult.success == false) {
    ::std::__cxx11::string::string(local_50,"\nError: %s",&local_91);
    ::std::__cxx11::string::string
              ((string *)&local_70,
               (string *)&(this->super_QueryResult).super_BaseQueryResult.error.final_message);
    StringUtil::Format<std::__cxx11::string>(&local_90,(StringUtil *)local_50,&local_70,in_RCX);
    ::std::__cxx11::string::append((string *)&error_str);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string(local_50);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this_00,&error_str);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StreamQueryResult::CheckExecutableInternal(ClientContextLock &lock) {
	if (!IsOpenInternal(lock)) {
		string error_str = "Attempting to execute an unsuccessful or closed pending query result";
		if (HasError()) {
			error_str += StringUtil::Format("\nError: %s", GetError());
		}
		throw InvalidInputException(error_str);
	}
}